

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::OneofOptions::ByteSizeLong(OneofOptions *this)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  size_t sVar1;
  void **ppvVar2;
  const_iterator cVar3;
  size_t sVar4;
  
  sVar1 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  sVar1 = sVar1 + (long)*(int *)((long)&this->field_0 + 0x28) * 2;
  this_00 = &(this->field_0)._impl_.uninterpreted_option_;
  ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar3 = RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_00);
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      ((UninterpretedOption *)*ppvVar2);
    sVar1 = sVar1 + sVar4;
  }
  if ((*(byte *)((long)&this->field_0 + 0x18) & 1) != 0) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                      ((this->field_0)._impl_.features_);
    sVar1 = sVar1 + sVar4 + 1;
  }
  sVar1 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar1,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t OneofOptions::ByteSizeLong() const {
  const OneofOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.OneofOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
   {
    // optional .google.protobuf.FeatureSet features = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}